

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void readBup<BupHeaderSwitch>(istream *stream,BupHeader *header)

{
  BupExpressionChunk *out;
  pointer pBVar1;
  pointer pBVar2;
  bool bVar3;
  BupChunkSwitch BVar4;
  size_t len;
  ostream *poVar5;
  BupChunk *chunk;
  pointer pBVar6;
  ulong __val;
  long lVar7;
  string local_e0;
  string local_c0;
  BupHeaderSwitch h;
  BupExpressionChunkSwitch c;
  
  header->isSwitch = true;
  readRaw<BupHeaderSwitch>(&h,stream);
  copyTo<BupHeaderSwitch>(header,&h);
  std::istream::ignore((long)stream);
  pBVar1 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar6 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar6 != pBVar1; pBVar6 = pBVar6 + 1) {
    BVar4 = readRaw<BupChunkSwitch>(stream);
    pBVar6->offset = (uint32_t)BVar4.offset.value_.value_;
  }
  std::istream::ignore((long)stream);
  lVar7 = 0;
  for (__val = 0;
      pBVar2 = (header->expChunks).
               super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
               super__Vector_impl_data._M_start,
      __val < (ulong)((long)(header->expChunks).
                            super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 6);
      __val = __val + 1) {
    out = (BupExpressionChunk *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar7);
    readRaw<BupExpressionChunkSwitch>(&c,stream);
    copyTo<BupExpressionChunkSwitch>(out,&c);
    len = strnlen(c.name,0x14);
    toUTF8_abi_cxx11_(&local_c0,c.name,len);
    std::__cxx11::string::operator=((string *)out,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    bVar3 = allZero<std::array<boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>,6ul>>
                      (&c.unk);
    if (!bVar3) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Expression ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,(string *)out);
      poVar5 = std::operator<<(poVar5,", had unexpected nonzero values in its expression data...");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    if (*(long *)((long)&(pBVar2->name)._M_string_length + lVar7) == 0) {
      std::__cxx11::to_string(&local_e0,__val);
      std::operator+(&local_c0,"expression",&local_e0);
      std::__cxx11::string::operator=((string *)out,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    lVar7 = lVar7 + 0x40;
  }
  return;
}

Assistant:

void readBup(std::istream& stream, BupHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	copyTo(header, h);

	// Skip bytes for unknown reason
	stream.ignore(h.tbl1.value() * h.skipAmount);

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		copyTo(chunk, c);
	}

	stream.ignore(h.skipAmount2);

	for (size_t i = 0; i < header.expChunks.size(); i++) {
		auto& expChunk = header.expChunks[i];

		auto c = readRaw<typename Header::ExpressionChunk>(stream);
		copyTo(expChunk, c);
		expChunk.name = toUTF8(c.name, strnlen(c.name, sizeof(c.name)));

		if (!c.unkBytesValid()) {
			std::cerr << "Expression " << i << ", " << expChunk.name << ", had unexpected nonzero values in its expression data..." << std::endl;
		}

		if (expChunk.name.empty()) {
			expChunk.name = "expression" + std::to_string(i);
		}
	}
}